

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O2

Symbol * cs222::evaluateExpression
                   (Symbol *__return_storage_ptr__,Instruction *inst,string *expr,
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>_>_>
                   *symtab)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  const_iterator cVar4;
  allocator local_dd;
  Type local_dc;
  string local_d8;
  int resultValue;
  string secondTerm;
  string firstTerm;
  smatch match;
  
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  match._M_begin._M_current = (char *)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
            (expr,&match,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)Parser::op_regex_abi_cxx11_,0);
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::position(&match,0);
  std::__cxx11::string::substr((ulong)&firstTerm,(ulong)expr);
  std::__cxx11::string::substr((ulong)&secondTerm,(ulong)expr);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (&firstTerm,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                     Parser::label_regex_abi_cxx11_,0);
  if (bVar1) {
    bVar1 = hashtableContains<std::__cxx11::string,cs222::Symbol>(symtab,&firstTerm);
    if (!bVar1) {
      std::__cxx11::string::string
                ((string *)&resultValue,"Undefined symbol: ",(allocator *)&local_dc);
      std::operator+(&local_d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &resultValue,&firstTerm);
      Instruction::addError(inst,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&resultValue);
      std::__cxx11::string::string((string *)&local_d8,"",&local_dd);
      resultValue = 0;
      local_dc = ABSOLUTE;
      Symbol::Symbol(__return_storage_ptr__,&local_d8,&resultValue,&local_dc);
      goto LAB_0011e66e;
    }
    cVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)symtab,&firstTerm);
    iVar2 = Symbol::getValue((Symbol *)
                             ((long)cVar4.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>,_true>
                                    ._M_cur + 0x28));
  }
  else {
    iVar2 = std::__cxx11::stoi(&firstTerm,(size_t *)0x0,10);
  }
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (&secondTerm,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                     Parser::label_regex_abi_cxx11_,0);
  if (bVar1) {
    bVar1 = hashtableContains<std::__cxx11::string,cs222::Symbol>(symtab,&secondTerm);
    if (!bVar1) {
      std::__cxx11::string::string
                ((string *)&resultValue,"Undefined symbol: ",(allocator *)&local_dc);
      std::operator+(&local_d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &resultValue,&secondTerm);
      Instruction::addError(inst,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&resultValue);
      std::__cxx11::string::string((string *)&local_d8,"",&local_dd);
      resultValue = 0;
      local_dc = ABSOLUTE;
      Symbol::Symbol(__return_storage_ptr__,&local_d8,&resultValue,&local_dc);
      goto LAB_0011e66e;
    }
    cVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)symtab,&secondTerm);
    iVar3 = Symbol::getValue((Symbol *)
                             ((long)cVar4.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Symbol>,_true>
                                    ._M_cur + 0x28));
  }
  else {
    iVar3 = std::__cxx11::stoi(&secondTerm,(size_t *)0x0,10);
  }
  resultValue = iVar3 + iVar2;
  Instruction::getLabel_abi_cxx11_(&local_d8,inst);
  local_dc = ABSOLUTE;
  Symbol::Symbol(__return_storage_ptr__,&local_d8,&resultValue,&local_dc);
LAB_0011e66e:
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&secondTerm);
  std::__cxx11::string::~string((string *)&firstTerm);
  std::
  _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&match);
  return __return_storage_ptr__;
}

Assistant:

Symbol evaluateExpression(
            Instruction& inst,
            const std::string& expr,
            const std::unordered_map<std::string, Symbol>& symtab)
    {
        std::smatch match;
        std::regex_search(expr, match, Parser::op_regex);
        size_t opPos = match.position();
        std::string firstTerm = expr.substr(0, opPos);
        std::string secondTerm = expr.substr(opPos+1);

        int firstTermValue, secondTermValue;
        if (std::regex_match(firstTerm, Parser::label_regex))
        {
            if (!hashtableContains(symtab, firstTerm))
            {
                inst.addError(std::string("Undefined symbol: ") +
                        firstTerm);
                return Symbol("", 0, Symbol::ABSOLUTE);
            }
            firstTermValue = symtab.find(firstTerm)->second.getValue();
        }
        else
        {
            firstTermValue = std::stoi(firstTerm);
        }
        if (std::regex_match(secondTerm, Parser::label_regex))
        {
            if (!hashtableContains(symtab, secondTerm))
            {
                inst.addError(std::string("Undefined symbol: ") +
                        secondTerm);
                return Symbol("", 0, Symbol::ABSOLUTE);
            }
            secondTermValue = symtab.find(secondTerm)->second.getValue();
        }
        else
        {
            secondTermValue = std::stoi(secondTerm);
        }

        int resultValue = firstTermValue + secondTermValue;
        return Symbol(inst.getLabel(), resultValue, Symbol::ABSOLUTE);
    }